

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

void __thiscall
helics::HandleManager::addFilterAlias
          (HandleManager *this,string_view interfaceName,string_view alias)

{
  iterator iVar1;
  runtime_error *this_00;
  MapType *this_01;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  pVar2;
  int local_34;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  key_type local_20;
  
  local_30._M_str = alias._M_str;
  local_30._M_len = alias._M_len;
  local_20._M_str = interfaceName._M_str;
  local_20._M_len = interfaceName._M_len;
  this_01 = &this->filters;
  iVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_01->_M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_01->_M_h,&local_30);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_34 = *(int *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                                ._M_cur + 0x18);
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,int>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_01,&local_20);
    }
  }
  else {
    local_34 = *(int *)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                              ._M_cur + 0x18);
    pVar2 = std::__detail::
            _Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::try_emplace<std::basic_string_view<char,std::char_traits<char>>const&,int>
                      ((_Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this_01,(const_iterator)0x0,&local_30,&local_34);
    if ((((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (*(int *)((long)pVar2.first.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                + 0x18) !=
        *(int *)((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                       ._M_cur + 0x18))) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"filter name and alias already exists");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void HandleManager::addFilterAlias(std::string_view interfaceName, std::string_view alias)
{
    auto fnd = filters.find(interfaceName);
    if (fnd != filters.end()) {
        auto res = filters.try_emplace(alias, fnd->second.baseValue());
        if (!res.second && res.first->second != fnd->second) {
            throw std::runtime_error("filter name and alias already exists");
        }
    } else {
        fnd = filters.find(alias);
        if (fnd != filters.end()) {
            filters.emplace(interfaceName, fnd->second.baseValue());
        }
    }
}